

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

int QtPrivate::compareStrings(QStringView lhs,QStringView rhs,CaseSensitivity cs)

{
  char16_t cVar1;
  char16_t cVar2;
  int iVar3;
  ulong blen;
  ulong alen;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  alen = lhs.m_size;
  blen = rhs.m_size;
  if (cs != CaseSensitive) {
    iVar4 = ucstricmp(alen,lhs.m_data,blen,rhs.m_data);
    return iVar4;
  }
  uVar5 = blen;
  if (alen < blen) {
    uVar5 = alen;
  }
  iVar4 = 0;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      cVar1 = lhs.m_data[uVar6];
      cVar2 = rhs.m_data[uVar6];
      iVar4 = (uint)(ushort)cVar1 - (uint)(ushort)cVar2;
      if (cVar1 != cVar2) goto LAB_00124fd0;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    iVar4 = 0;
  }
LAB_00124fd0:
  iVar3 = (((long)blen < (long)alen) - 1) + (uint)((long)blen < (long)alen);
  if (alen == blen) {
    iVar3 = 0;
  }
  if (iVar4 != 0) {
    iVar3 = iVar4;
  }
  return iVar3;
}

Assistant:

int QtPrivate::compareStrings(QStringView lhs, QStringView rhs, Qt::CaseSensitivity cs) noexcept
{
    if (cs == Qt::CaseSensitive)
        return ucstrcmp(lhs.utf16(), lhs.size(), rhs.utf16(), rhs.size());
    return ucstricmp(lhs.size(), lhs.utf16(), rhs.size(), rhs.utf16());
}